

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int *buf_len_00;
  uint uVar1;
  char **ppcVar2;
  char **ppcVar3;
  uint uVar4;
  int iVar5;
  yang_token yVar6;
  FILE *__stream;
  char *pcVar7;
  FILE *pFVar8;
  FILE *pFVar9;
  char *pcVar10;
  ulong uVar11;
  char **ppcVar12;
  ulong uVar13;
  long lVar14;
  FILE *__stream_00;
  char *pcVar15;
  char *local_80;
  char *prefix;
  char **local_70;
  char **import_prefixes;
  char *name_space;
  FILE *local_58;
  char **local_50;
  char **import_modules;
  int import_count;
  int buf_len;
  char *buf;
  
  pcVar15 = ".";
  if (argc == 1) {
LAB_00101a7f:
    __stream = (FILE *)0x0;
LAB_00101a81:
    pFVar8 = (FILE *)0x0;
  }
  else {
    if (argc == 3) {
      pcVar10 = argv[2];
      pcVar7 = argv[1];
      if (argv[1] == (char *)0x0) {
        if (pcVar10 != (char *)0x0) {
          main_cold_1();
          iVar5 = 1;
          pFVar8 = _import_count;
          goto LAB_001020a9;
        }
        goto LAB_00101a7f;
      }
    }
    else {
      if (argc != 2) {
        main_cold_9();
        return 1;
      }
      pcVar7 = argv[1];
      if ((((*pcVar7 == '-') && (pcVar7[1] == 'h')) && (pcVar7[2] == '\0')) ||
         (iVar5 = strcmp(pcVar7,"--help"), iVar5 == 0)) {
        fprintf(_stdout,"Usage:\n\t%s [input-file] [output-file]\n",*argv);
        return 0;
      }
      pcVar10 = (char *)0x0;
    }
    pcVar15 = pcVar7;
    __stream = fopen(pcVar15,"r");
    if (__stream == (FILE *)0x0) {
      main_cold_2();
      return 1;
    }
    pcVar7 = strrchr(pcVar15,0x2f);
    if (pcVar7 == (char *)0x0) {
      pcVar15 = ".";
    }
    else {
      *pcVar7 = '\0';
    }
    if (pcVar10 == (char *)0x0) goto LAB_00101a81;
    pFVar8 = fopen(pcVar10,"w");
  }
  local_58 = pFVar8;
  if (pFVar8 == (FILE *)0x0) {
    local_58 = _stdout;
  }
  __stream_00 = __stream;
  if (__stream == (FILE *)0x0) {
    __stream_00 = _stdin;
  }
  _import_count = (FILE *)0x0;
  import_modules._4_4_ = 0;
  pcVar7 = get_word((FILE *)__stream_00,(char **)&import_count,(int *)((long)&import_modules + 4));
  if (pcVar7 == (char *)0x0) {
    free(_import_count);
    iVar5 = -1;
  }
  else {
    buf = (char *)pFVar8;
    yVar6 = get_keyword(pcVar7,(yang_arg *)&name_space);
    if ((yVar6 == YANG_MODULE) || (yVar6 == YANG_SUBMODULE)) {
      pcVar7 = get_word((FILE *)__stream_00,(char **)&import_count,
                        (int *)((long)&import_modules + 4));
      if ((pcVar7 != (char *)0x0) &&
         (iVar5 = find_namespace_imports
                            ((FILE *)__stream_00,(char **)&import_count,
                             (int *)((long)&import_modules + 4),(char **)&import_prefixes,&local_80,
                             &local_50,&local_70,(int *)&import_modules), ppcVar12 = import_prefixes
         , iVar5 == 0)) {
        if (yVar6 == YANG_SUBMODULE) {
          pFVar9 = (FILE *)open_module((char *)import_prefixes,pcVar15);
          if (pFVar9 == (FILE *)0x0) {
LAB_00101fe8:
            pFVar9 = (FILE *)0x0;
            fprintf(_stderr,"Failed to open the module \"%s\".\n",ppcVar12);
            goto LAB_00102029;
          }
          free(ppcVar12);
          import_prefixes = (char **)0x0;
          iVar5 = find_namespace_imports
                            ((FILE *)pFVar9,(char **)&import_count,
                             (int *)((long)&import_modules + 4),(char **)&import_prefixes,
                             (char **)0x0,(char ***)0x0,(char ***)0x0,(int *)0x0);
          if (iVar5 == 0) {
            fclose(pFVar9);
            goto LAB_00101c14;
          }
          iVar5 = -1;
          pFVar8 = (FILE *)buf;
        }
        else {
LAB_00101c14:
          if (0 < (int)(uint)import_modules) {
            lVar14 = 0;
            do {
              pFVar9 = (FILE *)open_module(local_50[lVar14],pcVar15);
              if (pFVar9 == (FILE *)0x0) {
                ppcVar12 = (char **)local_50[lVar14];
                goto LAB_00101fe8;
              }
              free(local_50[lVar14]);
              local_50[lVar14] = (char *)0x0;
              iVar5 = find_namespace_imports
                                ((FILE *)pFVar9,(char **)&import_count,
                                 (int *)((long)&import_modules + 4),local_50 + lVar14,(char **)0x0,
                                 (char ***)0x0,(char ***)0x0,(int *)0x0);
              if (iVar5 != 0) goto LAB_00102029;
              fclose(pFVar9);
              lVar14 = lVar14 + 1;
            } while (lVar14 < (int)(uint)import_modules);
          }
          rewind(__stream_00);
          fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,local_58);
          pcVar15 = get_word((FILE *)__stream_00,(char **)&import_count,
                             (int *)((long)&import_modules + 4));
          if (pcVar15 != (char *)0x0) {
            yVar6 = get_keyword(pcVar15,(yang_arg *)&name_space);
            pFVar8 = (FILE *)buf;
            uVar4 = (uint)import_modules;
            ppcVar3 = local_50;
            ppcVar2 = import_prefixes;
            ppcVar12 = local_70;
            pcVar7 = local_80;
            if ((yVar6 == YANG_MODULE) || (yVar6 == YANG_SUBMODULE)) {
              uVar11 = (ulong)(uint)import_modules;
              name_space._4_4_ = (yang_arg)name_space;
              if (yVar6 == YANG_SUBMODULE) {
                fwrite("<submodule name=\"",0x11,1,local_58);
                pcVar15 = "submodule";
                pFVar8 = (FILE *)buf;
LAB_00101d99:
                if ((yang_arg)name_space != Y_IDENTIF_ARG) {
                  main_cold_3();
                  goto LAB_00101f3a;
                }
                pcVar10 = get_word((FILE *)__stream_00,(char **)&import_count,
                                   (int *)((long)&import_modules + 4));
                pFVar9 = local_58;
                iVar5 = -1;
                if (pcVar10 != (char *)0x0) {
                  fprintf(local_58,"%s\"",pcVar10);
                  uVar1 = (uint)(yVar6 != YANG_MODULE) * 3 + 8;
                  fprintf(pFVar9,"\n%*sxmlns=\"urn:ietf:params:xml:ns:yang:yin:1\"",uVar1," ");
                  prefix._4_4_ = uVar1;
                  fprintf(pFVar9,"\n%*sxmlns:%s=\"%s\"",uVar1," ",pcVar7,ppcVar2);
                  if (0 < (int)uVar4) {
                    uVar13 = 0;
                    do {
                      fprintf(pFVar9,"\n%*sxmlns:%s=\"%s\"",(ulong)prefix._4_4_," ",ppcVar12[uVar13]
                              ,ppcVar3[uVar13]);
                      uVar13 = uVar13 + 1;
                    } while (uVar11 != uVar13);
                  }
                  buf_len_00 = (int *)((long)&import_modules + 4);
                  pcVar7 = get_word((FILE *)__stream_00,(char **)&import_count,buf_len_00);
                  pFVar8 = (FILE *)buf;
                  if (pcVar7 != (char *)0x0) {
                    yVar6 = get_keyword(pcVar7,(yang_arg *)((long)&name_space + 4));
                    if (yVar6 != YANG_LEFT_BRACE) {
                      iVar5 = -1;
                      if (yVar6 == YANG_UNKNOWN) {
                        pcVar10 = "Unexpected characters (\"%.20s\"...).\n";
                        pFVar8 = _stderr;
LAB_00101f8a:
                        fprintf(pFVar8,pcVar10,pcVar7);
                        pFVar8 = (FILE *)buf;
                      }
                      else {
                        main_cold_4();
                        pFVar8 = (FILE *)buf;
                      }
                      goto LAB_00101f95;
                    }
                    fwrite(">\n",2,1,local_58);
                    do {
                      pcVar7 = get_word((FILE *)__stream_00,(char **)&import_count,buf_len_00);
                      pFVar8 = (FILE *)buf;
                      if (pcVar7 == (char *)0x0) break;
                      yVar6 = get_keyword(pcVar7,(yang_arg *)((long)&name_space + 4));
                      if (yVar6 == YANG_RIGHT_BRACE) {
                        pcVar10 = "</%s>\n";
                        iVar5 = 0;
                        pcVar7 = pcVar15;
                        pFVar8 = local_58;
                        goto LAB_00101f8a;
                      }
                      if (yVar6 == YANG_UNKNOWN) {
                        fprintf(_stderr,"Unexpected characters (\"%.20s\"...).\n",pcVar7);
                        pFVar8 = (FILE *)buf;
                        break;
                      }
                      iVar5 = print_keyword(yVar6,name_space._4_4_,(FILE *)local_58,1,
                                            (FILE *)__stream_00,(char **)&import_count,buf_len_00);
                      pFVar8 = (FILE *)buf;
                    } while (iVar5 == 0);
                  }
                  goto LAB_00101f3a;
                }
              }
              else {
                if (yVar6 == YANG_MODULE) {
                  fwrite("<module name=\"",0xe,1,local_58);
                  pcVar15 = "module";
                  goto LAB_00101d99;
                }
                main_cold_5();
LAB_00101f3a:
                iVar5 = -1;
              }
LAB_00101f95:
              pFVar9 = (FILE *)0x0;
              goto LAB_0010202d;
            }
            if (yVar6 == YANG_UNKNOWN) {
              pFVar9 = (FILE *)0x0;
              fprintf(_stderr,"Unexpected characters (\"%.20s\"...).\n",pcVar15);
              goto LAB_00102029;
            }
            main_cold_6();
          }
          pFVar9 = (FILE *)0x0;
LAB_00102029:
          iVar5 = -1;
          pFVar8 = (FILE *)buf;
        }
LAB_0010202d:
        free(import_prefixes);
        free(local_80);
        if (0 < (int)(uint)import_modules) {
          lVar14 = 0;
          do {
            free(local_50[lVar14]);
            free(local_70[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 < (int)(uint)import_modules);
        }
        free(local_50);
        free(local_70);
        if (pFVar9 != (FILE *)0x0) {
          fclose(pFVar9);
        }
        free(_import_count);
        goto LAB_0010209c;
      }
      free(_import_count);
    }
    else if (yVar6 == YANG_UNKNOWN) {
      main_cold_7();
    }
    else {
      main_cold_8();
    }
    iVar5 = -1;
    pFVar8 = (FILE *)buf;
  }
LAB_0010209c:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
LAB_001020a9:
  if (pFVar8 != (FILE *)0x0) {
    fclose(pFVar8);
  }
  return iVar5;
}

Assistant:

int
main(int argc, char **argv)
{
    const char *in_file = NULL, *out_file = NULL, *search_dir = ".";
    char *ptr;
    FILE *input = NULL, *output = NULL;
    int ret = 1;

    switch (argc) {
    case 1:
        break;
    case 2:
        if (!strcmp(argv[1], "-h") || !strcmp(argv[1], "--help")) {
            fprintf(stdout, "Usage:\n\t%s [input-file] [output-file]\n", argv[0]);
            return 0;
        }
        in_file = argv[1];
        break;
    case 3:
        in_file = argv[1];
        out_file = argv[2];
        break;
    default:
        fprintf(stderr, "Invalid arguments.\n");
        return 1;
    }

    if (in_file) {
        input = fopen(in_file, "r");
        if (!input) {
            fprintf(stderr, "Failed to open \"%s\" for reading (%s).\n", in_file, strerror(errno));
            goto cleanup;
        }

        if ((ptr = strrchr(in_file, '/'))) {
            *ptr = '\0';
            search_dir = in_file;
        }
    }
    if (out_file) {
        output = fopen(out_file, "w");
        if (!input) {
            fprintf(stderr, "Failed to open \"%s\" for writing (%s).\n", out_file, strerror(errno));
            goto cleanup;
        }
    }

    ret = convert_yang2yin(output ? output : stdout, input ? input : stdin, search_dir);

cleanup:
    if (input) {
        fclose(input);
    }
    if (output) {
        fclose(output);
    }
    return ret;
}